

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::Softmax::forward_dev_impl<dynet::Device_CPU>
          (Softmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  Tensor *pTVar2;
  runtime_error *this_00;
  real rVar3;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar4;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  DefaultDevice *local_1b8;
  array<long,_1> aStack_1b0;
  long local_1a8;
  StoragePointerType local_1a0;
  long lStack_198;
  long local_190;
  undefined1 local_188 [16];
  long local_178;
  StoragePointerType local_170;
  long lStack_168;
  long local_160;
  array<int,_2UL> local_158;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_138;
  long local_128;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_120;
  Tensor local_108;
  DefaultDevice *local_b0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_a8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  Tensor local_88;
  
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Softmax not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_88.d.d[0] = 1;
  x._M_len = 1;
  x._M_array = (iterator)&local_88;
  Dim::Dim(&local_108.d,x,(fx->d).bd);
  local_108.v = (float *)(this->super_Node).aux_mem;
  local_108.device = fx->device;
  local_188._0_4_ = 1;
  local_108.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.mem_pool = FXS;
  x_00._M_len = 1;
  x_00._M_array = (iterator)local_188;
  Dim::Dim(&local_88.d,x_00,(fx->d).bd);
  local_88.device = fx->device;
  local_88.v = (float *)((ulong)(fx->d).bd * 4 + (long)(this->super_Node).aux_mem);
  local_88.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.mem_pool = FXS;
  logsumexp<dynet::Device_CPU>
            (dev,*(xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,&local_88,&local_108);
  if ((fx->d).bd == 1) {
    TVar4 = Tensor::t<1>(*(xs->
                          super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start);
    rVar3 = as_scalar(&local_108);
    local_178 = CONCAT44(local_178._4_4_,rVar3);
    local_188 = (undefined1  [16])TVar4;
    local_138 = Tensor::t<1>(fx);
    aStack_1b0._M_elems[0] = (_Type)&local_138;
    local_1b8 = dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_1b8,
                (TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)local_188);
  }
  else {
    pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = (pTVar2->d).d[0];
    Tensor::tb<1>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_138,
                  pTVar2);
    Tensor::tb<1>(&local_120,&local_108);
    local_158._M_elems = (_Type)((ulong)uVar1 | 0x100000000);
    local_190 = local_120.m_dimensions.super_array<long,_2>._M_elems[1];
    local_1a0 = local_120.m_data;
    lStack_198 = local_120.m_dimensions.super_array<long,_2>._M_elems[0];
    local_1a8 = local_128;
    local_1b8 = (DefaultDevice *)local_138.m_data;
    aStack_1b0._M_elems[0] = (_Type)(_Type)local_138.m_dimensions.super_array<long,_1>._M_elems[0];
    local_170 = local_120.m_data;
    lStack_168 = local_120.m_dimensions.super_array<long,_2>._M_elems[0];
    local_188._0_8_ = local_138.m_data;
    local_188._8_8_ = local_138.m_dimensions.super_array<long,_1>._M_elems[0];
    local_178 = local_128;
    local_160 = local_120.m_dimensions.super_array<long,_2>._M_elems[1];
    Tensor::tb<1>(&local_a0,fx);
    local_b0 = dev->edevice;
    local_a8 = &local_a0;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_b0,
                (TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
                 *)local_188);
  }
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_88.bs);
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_108.bs);
  return;
}

Assistant:

void Softmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() != 1)
    throw std::runtime_error("Softmax not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  Tensor m(Dim({1},fx.d.bd), (float*)aux_mem + fx.d.bd, fx.device, DeviceMempool::FXS);
  logsumexp(dev, *xs[0], m, z);
  if(fx.d.bd == 1) {
    fx.t<1>().device(*dev.edevice) = (xs[0]->t<1>() - as_scalar(z)).exp();
  } else {
    Eigen::array<int, 2> bcast; bcast[0] = xs[0]->d.rows(); bcast[1] = 1;
    fx.tb<1>().device(*dev.edevice) = (xs[0]->tb<1>() - z.tb<1>().broadcast(bcast)).exp();
  }
}